

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O1

void ImageResizeCanvas(Image *image,int newWidth,int newHeight,int offsetX,int offsetY,Color fill)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  void *__dest;
  long lVar4;
  ulong uVar5;
  long lVar6;
  void *__src;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float local_58;
  
  if (((image->data != (void *)0x0) && (image->width != 0)) && (image->height != 0)) {
    if (1 < image->mipmaps) {
      TraceLog(4,"Image manipulation only applied to base mipmap level");
    }
    if (10 < image->format) {
      TraceLog(4,"Image manipulation not supported for compressed formats");
      return;
    }
    iVar1 = image->width;
    if ((iVar1 != newWidth) || (image->height != newHeight)) {
      fVar8 = (float)iVar1;
      fVar10 = (float)offsetX;
      if (offsetX < 0) {
        fVar8 = fVar8 + fVar10;
        lVar6 = (long)(int)(float)-offsetX;
        fVar10 = 0.0;
      }
      else {
        if (newWidth < offsetX + iVar1) {
          fVar8 = (float)(newWidth - offsetX);
        }
        lVar6 = 0;
      }
      fVar7 = (float)image->height;
      local_58 = (float)offsetY;
      if (offsetY < 0) {
        fVar7 = fVar7 + local_58;
        lVar4 = (long)(int)(float)-offsetY;
        local_58 = 0.0;
      }
      else {
        if (newHeight < image->height + offsetY) {
          fVar7 = (float)(newHeight - offsetY);
        }
        lVar4 = 0;
      }
      fVar9 = (float)newHeight;
      if (fVar7 <= (float)newHeight) {
        fVar9 = fVar7;
      }
      iVar2 = GetPixelDataSize(1,1,image->format);
      pvVar3 = calloc((long)(newHeight * newWidth * iVar2),1);
      if (0 < (int)fVar9) {
        fVar7 = (float)newWidth;
        if (fVar8 <= (float)newWidth) {
          fVar7 = fVar8;
        }
        uVar5 = (ulong)(uint)(int)fVar9;
        __dest = (void *)((long)pvVar3 + (long)(((int)fVar10 + (int)local_58 * newWidth) * iVar2));
        __src = (void *)((lVar6 + lVar4 * iVar1) * (long)iVar2 + (long)image->data);
        do {
          memcpy(__dest,__src,(long)((int)fVar7 * iVar2));
          __dest = (void *)((long)__dest + (long)(iVar2 * newWidth));
          __src = (void *)((long)__src + (long)iVar2 * (long)iVar1);
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
      }
      free(image->data);
      image->data = pvVar3;
      image->width = newWidth;
      image->height = newHeight;
    }
  }
  return;
}

Assistant:

void ImageResizeCanvas(Image *image, int newWidth, int newHeight, int offsetX, int offsetY, Color fill)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    if (image->mipmaps > 1) TRACELOG(LOG_WARNING, "Image manipulation only applied to base mipmap level");
    if (image->format >= PIXELFORMAT_COMPRESSED_DXT1_RGB) TRACELOG(LOG_WARNING, "Image manipulation not supported for compressed formats");
    else if ((newWidth != image->width) || (newHeight != image->height))
    {
        Rectangle srcRec = { 0, 0, (float)image->width, (float)image->height };
        Vector2 dstPos = { (float)offsetX, (float)offsetY };

        if (offsetX < 0)
        {
            srcRec.x = (float)-offsetX;
            srcRec.width += (float)offsetX;
            dstPos.x = 0;
        }
        else if ((offsetX + image->width) > newWidth) srcRec.width = (float)(newWidth - offsetX);

        if (offsetY < 0)
        {
            srcRec.y = (float)-offsetY;
            srcRec.height += (float)offsetY;
            dstPos.y = 0;
        }
        else if ((offsetY + image->height) > newHeight) srcRec.height = (float)(newHeight - offsetY);

        if (newWidth < srcRec.width) srcRec.width = (float)newWidth;
        if (newHeight < srcRec.height) srcRec.height = (float)newHeight;

        int bytesPerPixel = GetPixelDataSize(1, 1, image->format);
        unsigned char *resizedData = (unsigned char *)RL_CALLOC(newWidth*newHeight*bytesPerPixel, 1);

        // TODO: Fill resizedData with fill color (must be formatted to image->format)

        int dstOffsetSize = ((int)dstPos.y*newWidth + (int)dstPos.x)*bytesPerPixel;

        for (int y = 0; y < (int)srcRec.height; y++)
        {
            memcpy(resizedData + dstOffsetSize, ((unsigned char *)image->data) + ((y + (int)srcRec.y)*image->width + (int)srcRec.x)*bytesPerPixel, (int)srcRec.width*bytesPerPixel);
            dstOffsetSize += (newWidth*bytesPerPixel);
        }

        RL_FREE(image->data);
        image->data = resizedData;
        image->width = newWidth;
        image->height = newHeight;
    }
}